

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O0

Abc_Obj_t * Mpm_ManGetAbcNode(Abc_Ntk_t *pNtk,Vec_Int_t *vCopy,int iMigLit)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pFanin;
  int iObjId;
  Abc_Obj_t *pObj;
  int iMigLit_local;
  Vec_Int_t *vCopy_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Vec_IntEntry(vCopy,iMigLit);
  if (iVar1 < 0) {
    iVar1 = Abc_LitNot(iMigLit);
    iVar1 = Vec_IntEntry(vCopy,iVar1);
    if (iVar1 < 0) {
      __assert_fail("iObjId >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                    ,0x9e,"Abc_Obj_t *Mpm_ManGetAbcNode(Abc_Ntk_t *, Vec_Int_t *, int)");
    }
    pFanin = Abc_NtkObj(pNtk,iVar1);
    pNtk_local = (Abc_Ntk_t *)Abc_NtkCreateNodeInv(pNtk,pFanin);
    Entry = Abc_ObjId((Abc_Obj_t *)pNtk_local);
    Vec_IntWriteEntry(vCopy,iMigLit,Entry);
  }
  else {
    pNtk_local = (Abc_Ntk_t *)Abc_NtkObj(pNtk,iVar1);
  }
  return (Abc_Obj_t *)pNtk_local;
}

Assistant:

Abc_Obj_t * Mpm_ManGetAbcNode( Abc_Ntk_t * pNtk, Vec_Int_t * vCopy, int iMigLit )
{
    Abc_Obj_t * pObj;
    int iObjId = Vec_IntEntry( vCopy, iMigLit );
    if ( iObjId >= 0 )
        return Abc_NtkObj( pNtk, iObjId );
    iObjId = Vec_IntEntry( vCopy, Abc_LitNot(iMigLit) );
    assert( iObjId >= 0 );
    pObj = Abc_NtkCreateNodeInv( pNtk, Abc_NtkObj(pNtk, iObjId) );
    Vec_IntWriteEntry( vCopy, iMigLit, Abc_ObjId(pObj) );
    return pObj;
}